

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_plane_sse4.c
# Opt level: O0

void av1_highbd_warp_affine_sse4_1
               (int32_t *mat,uint16_t *ref,int width,int height,int stride,uint16_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               int bd,ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,
               int16_t delta)

{
  ushort uVar1;
  int sx4_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  byte bVar68;
  char cVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  short sVar90;
  uint uVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  long lVar95;
  long lVar96;
  ulong *puVar97;
  byte bVar98;
  int in_ECX;
  int iVar99;
  int iVar100;
  int iVar101;
  int in_EDX;
  int iVar102;
  int k_00;
  long in_RSI;
  int *in_RDI;
  int in_R8D;
  long in_R9;
  int iVar103;
  int iVar108;
  int iVar109;
  int iVar110;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  int iVar111;
  int iVar112;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  byte in_stack_00000030;
  byte in_stack_00000038;
  int in_stack_00000040;
  int *in_stack_00000048;
  short in_stack_00000060;
  short in_stack_00000068;
  __m128i *p_1;
  __m128i zero;
  __m128i max_val;
  __m128i res_16bit;
  __m128i res_hi_round;
  __m128i res_lo_round;
  __m128i round_const;
  __m128i res16_hi;
  __m128i res32_hi;
  __m128i p4_32;
  __m128i *dst16_4;
  __m128i *p4;
  __m128i res16_lo;
  __m128i res32_lo;
  __m128i p_32;
  __m128i *dst16;
  __m128i *p;
  __m128i res_hi;
  __m128i res_lo;
  __m128i res_odd;
  __m128i res_7;
  __m128i res_5;
  __m128i res_3;
  __m128i res_1;
  __m128i coeff_7;
  __m128i coeff_5;
  __m128i coeff_3;
  __m128i coeff_1;
  __m128i tmp_15;
  __m128i tmp_13;
  __m128i tmp_11;
  __m128i tmp_9;
  __m128i tmp_7;
  __m128i tmp_5;
  __m128i tmp_3;
  __m128i tmp_1;
  __m128i src_7;
  __m128i src_5;
  __m128i src_3;
  __m128i src_1;
  __m128i res_even;
  __m128i res_6;
  __m128i res_4;
  __m128i res_2;
  __m128i res_0;
  __m128i coeff_6;
  __m128i coeff_4;
  __m128i coeff_2;
  __m128i coeff_0;
  __m128i tmp_14;
  __m128i tmp_12;
  __m128i tmp_10;
  __m128i tmp_8;
  __m128i tmp_6;
  __m128i tmp_4;
  __m128i tmp_2;
  __m128i tmp_0;
  __m128i src_6;
  __m128i src_4;
  __m128i src_2;
  __m128i src_0;
  __m128i *src_8;
  int sy;
  __m128i src2_padded;
  __m128i src_padded;
  __m128i shuffle_reg_right;
  __m128i shuffle_reg_left;
  __m128i src_hi;
  __m128i src_lo;
  __m128i src2_01;
  __m128i src_01;
  __m128i src2;
  __m128i src;
  int sx;
  int iy_2;
  int out_of_boundary_right;
  int out_of_boundary_left;
  int iy_1;
  int iy;
  int32_t sy4;
  int32_t iy4;
  int32_t sx4;
  int32_t ix4;
  int64_t y4;
  int64_t x4;
  int64_t dst_y;
  int64_t dst_x;
  int32_t src_y;
  int32_t src_x;
  __m128i wt1;
  __m128i wt0;
  int w1;
  int w0;
  __m128i round_bits_const;
  __m128i round_bits_shift;
  __m128i res_sub_const;
  int offset_bits;
  int round_bits;
  __m128i res_add_const;
  __m128i reduce_bits_vert_const;
  __m128i reduce_bits_vert_shift;
  __m128i clip_pixel;
  int offset_bits_vert;
  int offset_bits_horiz;
  int reduce_bits_vert;
  int reduce_bits_horiz;
  int k;
  int j;
  int i;
  __m128i tmp [15];
  int32_t in_stack_ffffffffffffeaac;
  int32_t in_stack_ffffffffffffeab0;
  int in_stack_ffffffffffffeab4;
  uint in_stack_ffffffffffffeab8;
  undefined2 in_stack_ffffffffffffeabc;
  short in_stack_ffffffffffffeabe;
  WarpedFilterCoeff (*in_stack_ffffffffffffeac0) [8];
  int local_1538;
  int local_1530;
  int local_151c;
  uint in_stack_ffffffffffffeaf0;
  int in_stack_ffffffffffffeaf8;
  undefined4 in_stack_ffffffffffffeb00;
  int p_height_00;
  int height_00;
  uint sx_00;
  __m128i *in_stack_ffffffffffffeb10;
  __m128i *in_stack_ffffffffffffeb18;
  __m128i *in_stack_ffffffffffffeb20;
  undefined8 in_stack_ffffffffffffeb30;
  int reduce_bits_horiz_00;
  undefined6 local_14c8;
  short sStack_14c4;
  short sStack_14c2;
  undefined8 uStack_14c0;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 local_1388;
  undefined8 local_1378;
  undefined8 local_1368;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 local_1238;
  undefined8 local_1228;
  undefined8 local_1218;
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  int local_1094;
  int local_1088;
  int local_1084;
  byte local_fdc;
  byte local_f94;
  byte local_f8c;
  int local_f84;
  int local_f80;
  int local_f7c;
  undefined8 local_f78 [30];
  long local_e88;
  int local_e7c;
  int local_e78;
  int local_e74;
  long local_e70;
  int *local_e68;
  short local_e60;
  short local_e5e;
  short local_e5c;
  short local_e5a;
  undefined1 local_e58 [16];
  uint local_e3c;
  undefined1 local_e38 [16];
  uint local_e28;
  int local_e24;
  int local_e20;
  int local_e1c;
  int local_e18;
  int local_e14;
  int local_e10;
  int local_e0c;
  WarpedFilterCoeff (*local_e08) [8];
  WarpedFilterCoeff (*local_e00) [8];
  WarpedFilterCoeff (*local_df8) [8];
  WarpedFilterCoeff (*local_df0) [8];
  WarpedFilterCoeff (*local_de8) [8];
  WarpedFilterCoeff (*local_de0) [8];
  WarpedFilterCoeff (*local_dd8) [8];
  WarpedFilterCoeff (*local_dd0) [8];
  uint8_t (*local_dc8) [16];
  uint8_t (*local_dc0) [16];
  uint8_t *local_db8;
  uint8_t *local_db0;
  undefined1 (*local_da8) [16];
  undefined1 (*local_da0) [16];
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  uint8_t local_d18 [8];
  uint8_t auStack_d10 [8];
  undefined8 local_d08;
  undefined8 uStack_d00;
  uint8_t local_cf8 [8];
  uint8_t auStack_cf0 [8];
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined4 uStack_c30;
  undefined4 uStack_c2c;
  undefined4 local_c28;
  undefined4 uStack_c24;
  undefined4 uStack_c20;
  undefined4 uStack_c1c;
  undefined4 local_c18;
  undefined4 uStack_c14;
  undefined4 uStack_c10;
  undefined4 uStack_c0c;
  undefined4 local_c08;
  undefined4 uStack_c04;
  undefined4 uStack_c00;
  undefined4 uStack_bfc;
  undefined4 local_bf8;
  undefined4 uStack_bf4;
  undefined4 uStack_bf0;
  undefined4 uStack_bec;
  undefined4 local_be8;
  undefined4 uStack_be4;
  undefined4 uStack_be0;
  undefined4 uStack_bdc;
  undefined4 local_bd8;
  undefined4 uStack_bd4;
  undefined4 uStack_bd0;
  undefined4 uStack_bcc;
  undefined4 local_bc8;
  undefined4 uStack_bc4;
  undefined4 uStack_bc0;
  undefined4 uStack_bbc;
  undefined8 local_bb8;
  undefined4 uStack_bb0;
  undefined4 uStack_bac;
  undefined8 local_ba8;
  undefined4 uStack_ba0;
  undefined4 uStack_b9c;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined1 local_738 [16];
  undefined1 local_728 [16];
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  int local_6d8;
  int iStack_6d4;
  int iStack_6d0;
  int iStack_6cc;
  int local_6c8;
  int iStack_6c4;
  int iStack_6c0;
  int iStack_6bc;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  int local_678;
  int iStack_674;
  int iStack_670;
  int iStack_66c;
  int local_668;
  int iStack_664;
  int iStack_660;
  int iStack_65c;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  ulong local_598;
  undefined8 uStack_590;
  int local_588;
  int iStack_584;
  int iStack_580;
  int iStack_57c;
  ulong local_578;
  undefined8 uStack_570;
  int local_568;
  int iStack_564;
  int iStack_560;
  int iStack_55c;
  ulong local_558;
  undefined8 uStack_550;
  int local_548;
  int iStack_544;
  int iStack_540;
  int iStack_53c;
  ulong local_538;
  undefined8 uStack_530;
  int local_528;
  int iStack_524;
  int iStack_520;
  int iStack_51c;
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  ulong local_4f8;
  undefined8 uStack_4f0;
  ulong *local_4e0;
  ulong local_4d8;
  undefined8 uStack_4d0;
  ulong *local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  uint local_42c;
  int local_428;
  int iStack_424;
  int iStack_420;
  int iStack_41c;
  uint local_40c;
  int local_408;
  int iStack_404;
  int iStack_400;
  int iStack_3fc;
  undefined4 local_3ec;
  int local_3e8;
  int iStack_3e4;
  int iStack_3e0;
  int iStack_3dc;
  undefined4 local_3cc;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined4 local_3ac;
  int local_3a8;
  int iStack_3a4;
  int iStack_3a0;
  int iStack_39c;
  undefined4 local_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  longlong local_298;
  longlong lStack_290;
  __m128i *local_280;
  ulong local_278;
  undefined8 uStack_270;
  ulong *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 *local_240;
  ulong local_238;
  undefined8 uStack_230;
  ulong *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  ushort local_1b8;
  ushort uStack_1b6;
  ushort uStack_1b4;
  ushort uStack_1b2;
  ushort uStack_1b0;
  ushort uStack_1ae;
  ushort uStack_1ac;
  ushort uStack_1aa;
  longlong local_1a8;
  longlong lStack_1a0;
  __m128i *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  short local_178;
  short local_176;
  short local_174;
  short local_172;
  short local_170;
  short local_16e;
  short local_16c;
  short local_16a;
  undefined8 local_168;
  undefined8 uStack_160;
  short local_158;
  short local_156;
  short local_154;
  short local_152;
  short local_150;
  short local_14e;
  short local_14c;
  short local_14a;
  undefined8 local_148;
  undefined8 uStack_140;
  short local_138;
  short local_136;
  short local_134;
  short local_132;
  short local_130;
  short local_12e;
  short local_12c;
  short local_12a;
  undefined8 local_128;
  undefined8 uStack_120;
  short local_118;
  short local_116;
  short local_114;
  short local_112;
  short local_110;
  short local_10e;
  short local_10c;
  short local_10a;
  undefined8 local_108;
  undefined8 uStack_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  sx4_00 = in_stack_00000048[5];
  if (in_stack_00000048[8] == 0) {
    uVar91 = 0xe - sx4_00;
  }
  else {
    uVar91 = in_stack_00000048[6];
  }
  bVar68 = (byte)in_stack_00000040;
  cVar69 = (char)sx4_00;
  local_f94 = (bVar68 + 0xe) - cVar69;
  if (in_stack_00000040 == 10) {
    height_00 = 0x3ff;
  }
  else {
    height_00 = 0xff;
    if (in_stack_00000040 == 0xc) {
      height_00 = 0xfff;
    }
  }
  sVar90 = (short)height_00;
  uVar2 = CONCAT26(sVar90,CONCAT24(sVar90,CONCAT22(sVar90,sVar90)));
  uVar3 = CONCAT26(sVar90,CONCAT24(sVar90,CONCAT22(sVar90,sVar90)));
  local_e38._4_4_ = 0;
  local_e38._0_4_ = uVar91;
  uVar71 = local_e38._0_8_;
  local_f8c = (byte)uVar91;
  iVar99 = (1 << (local_f8c & 0x1f)) >> 1;
  uVar56 = CONCAT44(iVar99,iVar99);
  uVar57 = CONCAT44(iVar99,iVar99);
  iVar102 = 1 << (local_f94 & 0x1f);
  uVar58 = CONCAT44(iVar102,iVar102);
  uVar59 = CONCAT44(iVar102,iVar102);
  local_e3c = 0xe - (in_stack_00000048[5] + in_stack_00000048[6]);
  bVar98 = ((bVar68 - (char)in_stack_00000048[5]) + '\x0e') - (char)in_stack_00000048[6];
  p_height_00 = CONCAT13(bVar98,(int3)CONCAT22((short)((uint)in_stack_ffffffffffffeb00 >> 0x10),
                                               sVar90));
  k_00 = 1 << (bVar98 & 0x1f);
  iVar100 = -(k_00 + (1 << (bVar98 - 1 & 0x1f)));
  uVar60 = CONCAT44(iVar100,iVar100);
  uVar61 = CONCAT44(iVar100,iVar100);
  local_e58._4_4_ = 0;
  local_e58._0_4_ = local_e3c;
  uVar70 = local_e58._0_8_;
  local_fdc = (byte)local_e3c;
  iVar92 = (1 << (local_fdc & 0x1f)) >> 1;
  uVar62 = CONCAT44(iVar92,iVar92);
  uVar63 = CONCAT44(iVar92,iVar92);
  local_e1c = in_stack_00000048[10];
  local_e20 = in_stack_00000048[0xb];
  uVar64 = CONCAT44(local_e1c,local_e1c);
  uVar65 = CONCAT44(local_e1c,local_e1c);
  uVar66 = CONCAT44(local_e20,local_e20);
  uVar67 = CONCAT44(local_e20,local_e20);
  sx_00 = uVar91;
  local_e88 = in_R9;
  local_e7c = in_R8D;
  local_e78 = in_ECX;
  local_e74 = in_EDX;
  local_e70 = in_RSI;
  local_e68 = in_RDI;
  local_e5a = sVar90;
  local_e58 = ZEXT416(local_e3c);
  local_e38 = ZEXT416(uVar91);
  local_e28 = uVar91;
  local_e18 = iVar92;
  local_e14 = iVar100;
  local_e10 = iVar102;
  local_e0c = iVar99;
  local_188 = uVar2;
  uStack_180 = uVar3;
  local_178 = sVar90;
  local_176 = sVar90;
  local_174 = sVar90;
  local_172 = sVar90;
  local_170 = sVar90;
  local_16e = sVar90;
  local_16c = sVar90;
  local_16a = sVar90;
  local_108 = uVar56;
  uStack_100 = uVar57;
  local_f8 = iVar99;
  local_f4 = iVar99;
  local_f0 = iVar99;
  local_ec = iVar99;
  local_e8 = uVar58;
  uStack_e0 = uVar59;
  local_d8 = iVar102;
  local_d4 = iVar102;
  local_d0 = iVar102;
  local_cc = iVar102;
  local_c8 = uVar60;
  uStack_c0 = uVar61;
  local_b8 = iVar100;
  local_b4 = iVar100;
  local_b0 = iVar100;
  local_ac = iVar100;
  local_a8 = uVar62;
  uStack_a0 = uVar63;
  local_98 = iVar92;
  local_94 = iVar92;
  local_90 = iVar92;
  local_8c = iVar92;
  local_88 = uVar64;
  uStack_80 = uVar65;
  local_78 = local_e1c;
  local_74 = local_e1c;
  local_70 = local_e1c;
  local_6c = local_e1c;
  local_68 = uVar66;
  uStack_60 = uVar67;
  local_58 = local_e20;
  local_54 = local_e20;
  local_50 = local_e20;
  local_4c = local_e20;
  for (local_f7c = 0; local_f7c < in_stack_00000020; local_f7c = local_f7c + 8) {
    for (local_f80 = 0; local_f80 < in_stack_00000018; local_f80 = local_f80 + 8) {
      iVar93 = in_stack_00000008 + local_f80 + 4 << (in_stack_00000030 & 0x1f);
      iVar94 = in_stack_00000010 + local_f7c + 4 << (in_stack_00000038 & 0x1f);
      lVar95 = (long)local_e68[4] * (long)iVar93 + (long)local_e68[5] * (long)iVar94 +
               (long)local_e68[1] >> (in_stack_00000038 & 0x3f);
      iVar93 = (int)((ulong)((long)local_e68[2] * (long)iVar93 + (long)local_e68[3] * (long)iVar94 +
                             (long)*local_e68 >> (in_stack_00000030 & 0x3f)) >> 0x10);
      iVar94 = (int)((ulong)lVar95 >> 0x10);
      iVar101 = (int)in_stack_00000068;
      if (iVar93 < -6) {
        local_f84 = -7;
        while( true ) {
          if (in_stack_00000020 - local_f7c < 9) {
            in_stack_ffffffffffffeaf8 = in_stack_00000020 - local_f7c;
          }
          else {
            in_stack_ffffffffffffeaf8 = 8;
          }
          if (in_stack_ffffffffffffeaf8 <= local_f84) break;
          local_1084 = iVar94 + local_f84;
          if (local_1084 < 0) {
            local_1084 = 0;
          }
          else if (local_e78 + -1 < local_1084) {
            local_1084 = local_e78 + -1;
          }
          uVar1 = *(ushort *)(local_e70 + (long)(local_1084 * local_e7c) * 2);
          in_stack_ffffffffffffeaf0 = (uint)uVar1;
          local_e5c = (short)(1 << ((bVar68 - cVar69) + 6 & 0x1f)) +
                      uVar1 * (short)(1 << (7U - cVar69 & 0x1f));
          local_168 = CONCAT26(local_e5c,CONCAT24(local_e5c,CONCAT22(local_e5c,local_e5c)));
          uVar4 = CONCAT26(local_e5c,CONCAT24(local_e5c,CONCAT22(local_e5c,local_e5c)));
          uStack_160 = uVar4;
          local_158 = local_e5c;
          local_156 = local_e5c;
          local_154 = local_e5c;
          local_152 = local_e5c;
          local_150 = local_e5c;
          local_14e = local_e5c;
          local_14c = local_e5c;
          local_14a = local_e5c;
          local_f78[(long)(local_f84 + 7) * 2] = local_168;
          local_f78[(long)(local_f84 + 7) * 2 + 1] = uVar4;
          local_f84 = local_f84 + 1;
        }
      }
      else if (iVar93 < local_e74 + 6) {
        if ((iVar93 + -7 < 0) || (local_e74 < iVar93 + 9)) {
          iVar103 = -(iVar93 + -6);
          iVar108 = (iVar93 + 8) - local_e74;
          local_f84 = -7;
          while( true ) {
            if (in_stack_00000020 - local_f7c < 9) {
              local_1530 = in_stack_00000020 - local_f7c;
            }
            else {
              local_1530 = 8;
            }
            if (local_1530 <= local_f84) break;
            local_1094 = iVar94 + local_f84;
            if (local_1094 < 0) {
              local_1094 = 0;
            }
            else if (local_e78 + -1 < local_1094) {
              local_1094 = local_e78 + -1;
            }
            local_da0 = (undefined1 (*) [16])
                        (local_e70 + (long)(local_1094 * local_e7c) * 2 + -0xe + (long)iVar93 * 2);
            local_ce8 = *(undefined8 *)*local_da0;
            uStack_ce0 = *(undefined8 *)(*local_da0 + 8);
            local_da8 = (undefined1 (*) [16])
                        (local_e70 + (long)(local_1094 * local_e7c) * 2 + 2 + (long)iVar93 * 2);
            local_d08 = *(undefined8 *)*local_da8;
            uStack_d00 = *(undefined8 *)(*local_da8 + 8);
            local_db0 = "";
            local_cf8[0] = '\0';
            local_cf8[1] = '\x02';
            local_cf8[2] = '\x04';
            local_cf8[3] = '\x06';
            local_cf8[4] = '\b';
            local_cf8[5] = '\n';
            local_cf8[6] = '\f';
            local_cf8[7] = '\x0e';
            auStack_cf0[0] = '\x01';
            auStack_cf0[1] = '\x03';
            auStack_cf0[2] = '\x05';
            auStack_cf0[3] = '\a';
            auStack_cf0[4] = '\t';
            auStack_cf0[5] = '\v';
            auStack_cf0[6] = '\r';
            auStack_cf0[7] = '\x0f';
            auVar105[8] = '\x01';
            auVar105[9] = '\x03';
            auVar105[10] = '\x05';
            auVar105[0xb] = '\a';
            auVar105[0xc] = '\t';
            auVar105[0xd] = '\v';
            auVar105[0xe] = '\r';
            auVar105[0xf] = '\x0f';
            auVar105[0] = '\0';
            auVar105[1] = '\x02';
            auVar105[2] = '\x04';
            auVar105[3] = '\x06';
            auVar105[4] = '\b';
            auVar105[5] = '\n';
            auVar105[6] = '\f';
            auVar105[7] = '\x0e';
            auVar105 = pshufb(*local_da0,auVar105);
            local_db8 = "";
            local_d18[0] = '\0';
            local_d18[1] = '\x02';
            local_d18[2] = '\x04';
            local_d18[3] = '\x06';
            local_d18[4] = '\b';
            local_d18[5] = '\n';
            local_d18[6] = '\f';
            local_d18[7] = '\x0e';
            auStack_d10[0] = '\x01';
            auStack_d10[1] = '\x03';
            auStack_d10[2] = '\x05';
            auStack_d10[3] = '\a';
            auStack_d10[4] = '\t';
            auStack_d10[5] = '\v';
            auStack_d10[6] = '\r';
            auStack_d10[7] = '\x0f';
            auVar104[8] = '\x01';
            auVar104[9] = '\x03';
            auVar104[10] = '\x05';
            auVar104[0xb] = '\a';
            auVar104[0xc] = '\t';
            auVar104[0xd] = '\v';
            auVar104[0xe] = '\r';
            auVar104[0xf] = '\x0f';
            auVar104[0] = '\0';
            auVar104[1] = '\x02';
            auVar104[2] = '\x04';
            auVar104[3] = '\x06';
            auVar104[4] = '\b';
            auVar104[5] = '\n';
            auVar104[6] = '\f';
            auVar104[7] = '\x0e';
            auVar104 = pshufb(*local_da8,auVar104);
            local_10c8 = auVar105._0_8_;
            uStack_10c0 = auVar105._8_8_;
            local_10d8 = auVar104._0_8_;
            uStack_10d0 = auVar104._8_8_;
            local_c48 = local_10c8;
            uStack_c40 = uStack_10c0;
            local_c58 = local_10d8;
            uStack_c50 = uStack_10d0;
            uStack_10c0._4_4_ = auVar105._12_4_;
            uStack_10d0._4_4_ = auVar104._12_4_;
            uStack_b9c = uStack_10c0._4_4_;
            local_bb8 = local_10d8;
            uStack_bac = uStack_10d0._4_4_;
            local_10f8._8_4_ = uStack_ba0;
            local_10f8._12_4_ = uStack_10c0._4_4_;
            local_10e8._4_4_ = uStack_10d0._4_4_;
            local_10e8._0_4_ = uStack_bb0;
            local_10e8._8_8_ = local_10d8;
            if (-1 < iVar103) {
              local_dc0 = warp_pad_left + iVar103;
              local_d58 = *(undefined8 *)*local_dc0;
              uStack_d50 = *(undefined8 *)(warp_pad_left[iVar103] + 8);
              local_d28 = local_10e8._0_8_;
              uStack_d20 = local_10d8;
              auVar107._8_8_ = local_10d8;
              auVar107._0_8_ = local_10e8._0_8_;
              local_10e8 = pshufb(auVar107,(undefined1  [16])*local_dc0);
              local_d48 = local_10f8._0_8_;
              uStack_d40 = local_10f8._8_8_;
              auVar106._8_8_ = local_10f8._8_8_;
              auVar106._0_8_ = local_10f8._0_8_;
              local_10f8 = pshufb(auVar106,(undefined1  [16])*local_dc0);
              local_d38 = local_d58;
              uStack_d30 = uStack_d50;
            }
            if (-1 < iVar108) {
              local_dc8 = warp_pad_right + iVar108;
              local_d98 = *(undefined8 *)*local_dc8;
              uStack_d90 = *(undefined8 *)(warp_pad_right[iVar108] + 8);
              local_d68 = local_10e8._0_8_;
              uStack_d60 = local_10e8._8_8_;
              local_10e8 = pshufb(local_10e8,(undefined1  [16])*local_dc8);
              local_d88 = local_10f8._0_8_;
              uStack_d80 = local_10f8._8_8_;
              local_10f8 = pshufb(local_10f8,(undefined1  [16])*local_dc8);
              local_d78 = local_d98;
              uStack_d70 = uStack_d90;
            }
            local_b88 = local_10e8._0_8_;
            uStack_b80 = local_10e8._8_8_;
            local_b98 = local_10f8._0_8_;
            uStack_b90 = local_10f8._8_8_;
            local_b68 = local_10e8._0_8_;
            uStack_b60 = local_10e8._8_8_;
            local_b78 = local_10f8._0_8_;
            uStack_b70 = local_10f8._8_8_;
            local_ba8 = local_10c8;
            highbd_horiz_filter(in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18,
                                in_stack_ffffffffffffeb10,sx_00,height_00,k_00,
                                (int)in_stack_ffffffffffffeb30,reduce_bits_horiz_00);
            local_f84 = local_f84 + 1;
          }
        }
        else {
          highbd_prepare_warp_horizontal_filter
                    ((uint16_t *)in_stack_ffffffffffffeac0,
                     (__m128i *)
                     CONCAT26(in_stack_ffffffffffffeabe,
                              CONCAT24(in_stack_ffffffffffffeabc,in_stack_ffffffffffffeab8)),
                     in_stack_ffffffffffffeab4,in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac,
                     sx4_00,in_stack_ffffffffffffeaf0,in_stack_ffffffffffffeaf8,p_height_00,
                     height_00,(int)in_stack_ffffffffffffeb10,(int)in_stack_ffffffffffffeb18,
                     (int)in_stack_ffffffffffffeb20);
        }
      }
      else {
        local_f84 = -7;
        while( true ) {
          if (in_stack_00000020 - local_f7c < 9) {
            local_151c = in_stack_00000020 - local_f7c;
          }
          else {
            local_151c = 8;
          }
          if (local_151c <= local_f84) break;
          local_1088 = iVar94 + local_f84;
          if (local_1088 < 0) {
            local_1088 = 0;
          }
          else if (local_e78 + -1 < local_1088) {
            local_1088 = local_e78 + -1;
          }
          local_e5e = (short)(1 << ((bVar68 - cVar69) + 6 & 0x1f)) +
                      *(short *)(local_e70 + (long)(local_e74 + -1 + local_1088 * local_e7c) * 2) *
                      (short)(1 << (7U - cVar69 & 0x1f));
          local_148 = CONCAT26(local_e5e,CONCAT24(local_e5e,CONCAT22(local_e5e,local_e5e)));
          uVar4 = CONCAT26(local_e5e,CONCAT24(local_e5e,CONCAT22(local_e5e,local_e5e)));
          uStack_140 = uVar4;
          local_138 = local_e5e;
          local_136 = local_e5e;
          local_134 = local_e5e;
          local_132 = local_e5e;
          local_130 = local_e5e;
          local_12e = local_e5e;
          local_12c = local_e5e;
          local_12a = local_e5e;
          local_f78[(long)(local_f84 + 7) * 2] = local_148;
          local_f78[(long)(local_f84 + 7) * 2 + 1] = uVar4;
          local_f84 = local_f84 + 1;
        }
      }
      local_f84 = -4;
      while( true ) {
        if ((in_stack_00000020 - local_f7c) + -4 < 5) {
          local_1538 = (in_stack_00000020 - local_f7c) + -4;
        }
        else {
          local_1538 = 4;
        }
        if (local_1538 <= local_f84) break;
        iVar93 = (in_stack_00000060 * -4 + iVar101 * -4 + 0x10200 + ((uint)lVar95 & 0xffff) &
                 0xffffffc0) + (int)in_stack_00000068 * (local_f84 + 4);
        lVar96 = (long)local_f84;
        uVar4 = local_f78[lVar96 * 2 + 8];
        uStack_ae0 = local_f78[lVar96 * 2 + 9];
        uVar5 = local_f78[lVar96 * 2 + 10];
        uStack_af0 = local_f78[lVar96 * 2 + 0xb];
        local_ae8._0_2_ = (undefined2)uVar4;
        local_ae8._2_2_ = (undefined2)((ulong)uVar4 >> 0x10);
        local_ae8._4_2_ = (undefined2)((ulong)uVar4 >> 0x20);
        local_ae8._6_2_ = (undefined2)((ulong)uVar4 >> 0x30);
        local_af8._0_2_ = (undefined2)uVar5;
        local_af8._2_2_ = (undefined2)((ulong)uVar5 >> 0x10);
        local_af8._4_2_ = (undefined2)((ulong)uVar5 >> 0x20);
        local_af8._6_2_ = (undefined2)((ulong)uVar5 >> 0x30);
        uVar6 = local_f78[lVar96 * 2 + 0xc];
        uStack_b00 = local_f78[lVar96 * 2 + 0xd];
        uVar7 = local_f78[lVar96 * 2 + 0xe];
        uStack_b10 = local_f78[lVar96 * 2 + 0xf];
        local_b08._0_2_ = (undefined2)uVar6;
        local_b08._2_2_ = (undefined2)((ulong)uVar6 >> 0x10);
        local_b08._4_2_ = (undefined2)((ulong)uVar6 >> 0x20);
        local_b08._6_2_ = (undefined2)((ulong)uVar6 >> 0x30);
        local_b18._0_2_ = (undefined2)uVar7;
        local_b18._2_2_ = (undefined2)((ulong)uVar7 >> 0x10);
        local_b18._4_2_ = (undefined2)((ulong)uVar7 >> 0x20);
        local_b18._6_2_ = (undefined2)((ulong)uVar7 >> 0x30);
        uVar8 = local_f78[lVar96 * 2 + 0x10];
        uStack_b20 = local_f78[lVar96 * 2 + 0x11];
        uVar9 = local_f78[lVar96 * 2 + 0x12];
        uStack_b30 = local_f78[lVar96 * 2 + 0x13];
        local_b28._0_2_ = (undefined2)uVar8;
        local_b28._2_2_ = (undefined2)((ulong)uVar8 >> 0x10);
        local_b28._4_2_ = (undefined2)((ulong)uVar8 >> 0x20);
        local_b28._6_2_ = (undefined2)((ulong)uVar8 >> 0x30);
        local_b38._0_2_ = (undefined2)uVar9;
        local_b38._2_2_ = (undefined2)((ulong)uVar9 >> 0x10);
        local_b38._4_2_ = (undefined2)((ulong)uVar9 >> 0x20);
        local_b38._6_2_ = (undefined2)((ulong)uVar9 >> 0x30);
        uVar10 = local_f78[lVar96 * 2 + 0x14];
        uStack_b40 = local_f78[lVar96 * 2 + 0x15];
        uVar11 = local_f78[lVar96 * 2 + 0x16];
        uStack_b50 = local_f78[lVar96 * 2 + 0x17];
        local_b48._0_2_ = (undefined2)uVar10;
        local_b48._2_2_ = (undefined2)((ulong)uVar10 >> 0x10);
        local_b48._4_2_ = (undefined2)((ulong)uVar10 >> 0x20);
        local_b48._6_2_ = (undefined2)((ulong)uVar10 >> 0x30);
        local_b58._0_2_ = (undefined2)uVar11;
        local_b58._2_2_ = (undefined2)((ulong)uVar11 >> 0x10);
        local_b58._4_2_ = (undefined2)((ulong)uVar11 >> 0x20);
        local_b58._6_2_ = (undefined2)((ulong)uVar11 >> 0x30);
        in_stack_ffffffffffffeac0 = av1_warped_filter;
        local_dd0 = av1_warped_filter + (iVar93 >> 10);
        local_9a8 = *(undefined8 *)*local_dd0;
        uStack_a40 = *(undefined8 *)(av1_warped_filter[iVar93 >> 10] + 4);
        iVar94 = iVar93 + in_stack_00000060 * 2 >> 10;
        local_dd8 = av1_warped_filter + iVar94;
        local_9b8 = *(undefined8 *)*local_dd8;
        uStack_a50 = *(undefined8 *)(av1_warped_filter[iVar94] + 4);
        iVar94 = iVar93 + in_stack_00000060 * 4 >> 10;
        local_de0 = av1_warped_filter + iVar94;
        local_9c8 = *(undefined8 *)*local_de0;
        uStack_a60 = *(undefined8 *)(av1_warped_filter[iVar94] + 4);
        iVar94 = iVar93 + in_stack_00000060 * 6 >> 10;
        local_de8 = av1_warped_filter + iVar94;
        local_9d8 = *(undefined8 *)*local_de8;
        uStack_a70 = *(undefined8 *)(av1_warped_filter[iVar94] + 4);
        local_a48._0_4_ = (undefined4)local_9a8;
        local_a48._4_4_ = (undefined4)((ulong)local_9a8 >> 0x20);
        local_a58._0_4_ = (undefined4)local_9b8;
        local_a58._4_4_ = (undefined4)((ulong)local_9b8 >> 0x20);
        local_a68._0_4_ = (undefined4)local_9c8;
        local_a68._4_4_ = (undefined4)((ulong)local_9c8 >> 0x20);
        local_a78._0_4_ = (undefined4)local_9d8;
        local_a78._4_4_ = (undefined4)((ulong)local_9d8 >> 0x20);
        uStack_9a0._0_4_ = (undefined4)uStack_a40;
        uStack_9a0._4_4_ = (undefined4)((ulong)uStack_a40 >> 0x20);
        uStack_9b0._0_4_ = (undefined4)uStack_a50;
        uStack_9b0._4_4_ = (undefined4)((ulong)uStack_a50 >> 0x20);
        uStack_9c0._0_4_ = (undefined4)uStack_a60;
        uStack_9c0._4_4_ = (undefined4)((ulong)uStack_a60 >> 0x20);
        uStack_9d0._0_4_ = (undefined4)uStack_a70;
        uStack_9d0._4_4_ = (undefined4)((ulong)uStack_a70 >> 0x20);
        local_c68 = CONCAT44((undefined4)local_a58,(undefined4)local_a48);
        uStack_c60 = CONCAT44(local_a58._4_4_,local_a48._4_4_);
        local_c78 = CONCAT44((undefined4)local_a78,(undefined4)local_a68);
        uStack_c70 = CONCAT44(local_a78._4_4_,local_a68._4_4_);
        uStack_bbc = local_a58._4_4_;
        local_bb8 = CONCAT44(local_bb8._4_4_,(undefined4)local_a78);
        uStack_bcc = local_a78._4_4_;
        _local_bc8 = CONCAT44((undefined4)local_a58,(undefined4)local_a48);
        local_1218 = CONCAT44(local_a78._4_4_,uStack_bd0);
        local_c88 = CONCAT44((undefined4)uStack_9b0,(undefined4)uStack_9a0);
        uStack_c80 = CONCAT44(uStack_9b0._4_4_,uStack_9a0._4_4_);
        local_c98 = CONCAT44((undefined4)uStack_9d0,(undefined4)uStack_9c0);
        uStack_c90 = CONCAT44(uStack_9d0._4_4_,uStack_9c0._4_4_);
        uStack_bdc = uStack_9b0._4_4_;
        _local_bd8 = CONCAT44((undefined4)local_a78,(undefined4)local_a68);
        uStack_bec = uStack_9d0._4_4_;
        _local_be8 = CONCAT44((undefined4)uStack_9b0,(undefined4)uStack_9a0);
        local_1238 = CONCAT44(uStack_9d0._4_4_,uStack_bf0);
        local_8a8 = CONCAT26(local_af8._2_2_,
                             CONCAT24(local_ae8._2_2_,
                                      CONCAT22((undefined2)local_af8,(undefined2)local_ae8)));
        uStack_8a0 = CONCAT26(local_af8._6_2_,
                              CONCAT24(local_ae8._6_2_,CONCAT22(local_af8._4_2_,local_ae8._4_2_)));
        local_8b8 = local_1218;
        auVar35._8_8_ = uStack_8a0;
        auVar35._0_8_ = local_8a8;
        auVar34._8_8_ = local_c78;
        auVar34._0_8_ = local_1218;
        auVar104 = pmaddwd(auVar35,auVar34);
        local_8c8 = CONCAT26(local_b18._2_2_,
                             CONCAT24(local_b08._2_2_,
                                      CONCAT22((undefined2)local_b18,(undefined2)local_b08)));
        uStack_8c0 = CONCAT26(local_b18._6_2_,
                              CONCAT24(local_b08._6_2_,CONCAT22(local_b18._4_2_,local_b08._4_2_)));
        uStack_8d0 = CONCAT44(local_a58._4_4_,uStack_bc0);
        auVar33._8_8_ = uStack_8c0;
        auVar33._0_8_ = local_8c8;
        auVar32._8_8_ = uStack_8d0;
        auVar32._0_8_ = local_1228;
        auVar105 = pmaddwd(auVar33,auVar32);
        local_8e8 = CONCAT26(local_b38._2_2_,
                             CONCAT24(local_b28._2_2_,
                                      CONCAT22((undefined2)local_b38,(undefined2)local_b28)));
        uStack_8e0 = CONCAT26(local_b38._6_2_,
                              CONCAT24(local_b28._6_2_,CONCAT22(local_b38._4_2_,local_b28._4_2_)));
        local_8f8 = local_1238;
        auVar31._8_8_ = uStack_8e0;
        auVar31._0_8_ = local_8e8;
        auVar30._8_8_ = local_c98;
        auVar30._0_8_ = local_1238;
        auVar106 = pmaddwd(auVar31,auVar30);
        local_908 = CONCAT26(local_b58._2_2_,
                             CONCAT24(local_b48._2_2_,
                                      CONCAT22((undefined2)local_b58,(undefined2)local_b48)));
        uStack_900 = CONCAT26(local_b58._6_2_,
                              CONCAT24(local_b48._6_2_,CONCAT22(local_b58._4_2_,local_b48._4_2_)));
        uStack_910 = CONCAT44(uStack_9b0._4_4_,uStack_be0);
        auVar29._8_8_ = uStack_900;
        auVar29._0_8_ = local_908;
        auVar28._8_8_ = uStack_910;
        auVar28._0_8_ = local_1248;
        auVar107 = pmaddwd(auVar29,auVar28);
        local_1258 = auVar104._0_8_;
        uStack_1250 = auVar104._8_8_;
        local_1268 = auVar105._0_8_;
        uStack_1260 = auVar105._8_8_;
        local_628 = local_1258;
        uVar86 = local_628;
        uStack_620 = uStack_1250;
        uVar87 = uStack_620;
        local_638 = local_1268;
        uVar84 = local_638;
        uStack_630 = uStack_1260;
        uVar85 = uStack_630;
        local_628._0_4_ = auVar104._0_4_;
        local_628._4_4_ = auVar104._4_4_;
        uStack_620._0_4_ = auVar104._8_4_;
        uStack_620._4_4_ = auVar104._12_4_;
        local_638._0_4_ = auVar105._0_4_;
        local_638._4_4_ = auVar105._4_4_;
        uStack_630._0_4_ = auVar105._8_4_;
        uStack_630._4_4_ = auVar105._12_4_;
        local_668 = (int)local_628 + (int)local_638;
        iStack_664 = local_628._4_4_ + local_638._4_4_;
        iStack_660 = (int)uStack_620 + (int)uStack_630;
        iStack_65c = uStack_620._4_4_ + uStack_630._4_4_;
        local_1278 = auVar106._0_8_;
        uStack_1270 = auVar106._8_8_;
        local_1288 = auVar107._0_8_;
        uStack_1280 = auVar107._8_8_;
        local_648 = local_1278;
        uVar82 = local_648;
        uStack_640 = uStack_1270;
        uVar83 = uStack_640;
        local_658 = local_1288;
        uVar80 = local_658;
        uStack_650 = uStack_1280;
        uVar81 = uStack_650;
        local_648._0_4_ = auVar106._0_4_;
        local_648._4_4_ = auVar106._4_4_;
        uStack_640._0_4_ = auVar106._8_4_;
        uStack_640._4_4_ = auVar106._12_4_;
        local_658._0_4_ = auVar107._0_4_;
        local_658._4_4_ = auVar107._4_4_;
        uStack_650._0_4_ = auVar107._8_4_;
        uStack_650._4_4_ = auVar107._12_4_;
        local_678 = (int)local_648 + (int)local_658;
        iStack_674 = local_648._4_4_ + local_658._4_4_;
        iStack_670 = (int)uStack_640 + (int)uStack_650;
        iStack_66c = uStack_640._4_4_ + uStack_650._4_4_;
        iVar103 = local_668 + local_678;
        iVar108 = iStack_664 + iStack_674;
        iVar109 = iStack_660 + iStack_670;
        iVar111 = iStack_65c + iStack_66c;
        local_5a8 = local_f78[lVar96 * 2 + 8];
        uVar12 = local_f78[lVar96 * 2 + 9];
        local_5b8 = local_f78[lVar96 * 2 + 10];
        uVar13 = local_f78[lVar96 * 2 + 0xb];
        uStack_5a0._0_2_ = (undefined2)uVar12;
        uStack_5a0._2_2_ = (undefined2)((ulong)uVar12 >> 0x10);
        uStack_5a0._4_2_ = (undefined2)((ulong)uVar12 >> 0x20);
        uStack_5a0._6_2_ = (undefined2)((ulong)uVar12 >> 0x30);
        uStack_5b0._0_2_ = (undefined2)uVar13;
        uStack_5b0._2_2_ = (undefined2)((ulong)uVar13 >> 0x10);
        uStack_5b0._4_2_ = (undefined2)((ulong)uVar13 >> 0x20);
        uStack_5b0._6_2_ = (undefined2)((ulong)uVar13 >> 0x30);
        local_5c8 = local_f78[lVar96 * 2 + 0xc];
        uVar14 = local_f78[lVar96 * 2 + 0xd];
        local_5d8 = local_f78[lVar96 * 2 + 0xe];
        uVar15 = local_f78[lVar96 * 2 + 0xf];
        uStack_5c0._0_2_ = (undefined2)uVar14;
        uStack_5c0._2_2_ = (undefined2)((ulong)uVar14 >> 0x10);
        uStack_5c0._4_2_ = (undefined2)((ulong)uVar14 >> 0x20);
        uStack_5c0._6_2_ = (undefined2)((ulong)uVar14 >> 0x30);
        uStack_5d0._0_2_ = (undefined2)uVar15;
        uStack_5d0._2_2_ = (undefined2)((ulong)uVar15 >> 0x10);
        uStack_5d0._4_2_ = (undefined2)((ulong)uVar15 >> 0x20);
        uStack_5d0._6_2_ = (undefined2)((ulong)uVar15 >> 0x30);
        local_5e8 = local_f78[lVar96 * 2 + 0x10];
        uVar16 = local_f78[lVar96 * 2 + 0x11];
        local_5f8 = local_f78[lVar96 * 2 + 0x12];
        uVar17 = local_f78[lVar96 * 2 + 0x13];
        uStack_5e0._0_2_ = (undefined2)uVar16;
        uStack_5e0._2_2_ = (undefined2)((ulong)uVar16 >> 0x10);
        uStack_5e0._4_2_ = (undefined2)((ulong)uVar16 >> 0x20);
        uStack_5e0._6_2_ = (undefined2)((ulong)uVar16 >> 0x30);
        uStack_5f0._0_2_ = (undefined2)uVar17;
        uStack_5f0._2_2_ = (undefined2)((ulong)uVar17 >> 0x10);
        uStack_5f0._4_2_ = (undefined2)((ulong)uVar17 >> 0x20);
        uStack_5f0._6_2_ = (undefined2)((ulong)uVar17 >> 0x30);
        local_608 = local_f78[lVar96 * 2 + 0x14];
        uVar18 = local_f78[lVar96 * 2 + 0x15];
        local_618 = local_f78[lVar96 * 2 + 0x16];
        uVar19 = local_f78[lVar96 * 2 + 0x17];
        uStack_600._0_2_ = (undefined2)uVar18;
        uStack_600._2_2_ = (undefined2)((ulong)uVar18 >> 0x10);
        uStack_600._4_2_ = (undefined2)((ulong)uVar18 >> 0x20);
        uStack_600._6_2_ = (undefined2)((ulong)uVar18 >> 0x30);
        uStack_610._0_2_ = (undefined2)uVar19;
        uStack_610._2_2_ = (undefined2)((ulong)uVar19 >> 0x10);
        uStack_610._4_2_ = (undefined2)((ulong)uVar19 >> 0x20);
        uStack_610._6_2_ = (undefined2)((ulong)uVar19 >> 0x30);
        iVar94 = iVar93 + in_stack_00000060 >> 10;
        local_df0 = av1_warped_filter + iVar94;
        local_9e8 = *(undefined8 *)*local_df0;
        uStack_a80 = *(undefined8 *)(av1_warped_filter[iVar94] + 4);
        iVar94 = iVar93 + in_stack_00000060 * 3 >> 10;
        local_df8 = av1_warped_filter + iVar94;
        local_9f8 = *(undefined8 *)*local_df8;
        uStack_a90 = *(undefined8 *)(av1_warped_filter[iVar94] + 4);
        iVar94 = iVar93 + in_stack_00000060 * 5 >> 10;
        local_e00 = av1_warped_filter + iVar94;
        local_a08 = *(undefined8 *)*local_e00;
        uStack_aa0 = *(undefined8 *)(av1_warped_filter[iVar94] + 4);
        iVar93 = iVar93 + in_stack_00000060 * 7 >> 10;
        local_e08 = av1_warped_filter + iVar93;
        local_a18 = *(undefined8 *)*local_e08;
        uStack_ab0 = *(undefined8 *)(av1_warped_filter[iVar93] + 4);
        local_a88._0_4_ = (undefined4)local_9e8;
        local_a88._4_4_ = (undefined4)((ulong)local_9e8 >> 0x20);
        local_a98._0_4_ = (undefined4)local_9f8;
        local_a98._4_4_ = (undefined4)((ulong)local_9f8 >> 0x20);
        local_aa8._0_4_ = (undefined4)local_a08;
        local_aa8._4_4_ = (undefined4)((ulong)local_a08 >> 0x20);
        local_ab8._0_4_ = (undefined4)local_a18;
        local_ab8._4_4_ = (undefined4)((ulong)local_a18 >> 0x20);
        uStack_9e0._0_4_ = (undefined4)uStack_a80;
        uStack_9e0._4_4_ = (undefined4)((ulong)uStack_a80 >> 0x20);
        uStack_9f0._0_4_ = (undefined4)uStack_a90;
        uStack_9f0._4_4_ = (undefined4)((ulong)uStack_a90 >> 0x20);
        uStack_a00._0_4_ = (undefined4)uStack_aa0;
        uStack_a00._4_4_ = (undefined4)((ulong)uStack_aa0 >> 0x20);
        uStack_a10._0_4_ = (undefined4)uStack_ab0;
        uStack_a10._4_4_ = (undefined4)((ulong)uStack_ab0 >> 0x20);
        local_ca8 = CONCAT44((undefined4)local_a98,(undefined4)local_a88);
        uStack_ca0 = CONCAT44(local_a98._4_4_,local_a88._4_4_);
        local_cb8 = CONCAT44((undefined4)local_ab8,(undefined4)local_aa8);
        uStack_cb0 = CONCAT44(local_ab8._4_4_,local_aa8._4_4_);
        uStack_bfc = local_a98._4_4_;
        _local_bf8 = CONCAT44((undefined4)uStack_9d0,(undefined4)local_ab8);
        uStack_c0c = local_ab8._4_4_;
        _local_c08 = CONCAT44((undefined4)local_a98,(undefined4)local_a88);
        local_1368 = CONCAT44(local_ab8._4_4_,uStack_c10);
        local_cc8 = CONCAT44((undefined4)uStack_9f0,(undefined4)uStack_9e0);
        uStack_cc0 = CONCAT44(uStack_9f0._4_4_,uStack_9e0._4_4_);
        local_cd8 = CONCAT44((undefined4)uStack_a10,(undefined4)uStack_a00);
        uStack_cd0 = CONCAT44(uStack_a10._4_4_,uStack_a00._4_4_);
        local_c38 = CONCAT44((undefined4)uStack_a10,(undefined4)uStack_a00);
        uStack_c1c = uStack_9f0._4_4_;
        _local_c18 = CONCAT44((undefined4)local_ab8,(undefined4)local_aa8);
        uStack_c2c = uStack_a10._4_4_;
        _local_c28 = CONCAT44((undefined4)uStack_9f0,(undefined4)uStack_9e0);
        local_1388 = CONCAT44(uStack_a10._4_4_,uStack_c30);
        local_928 = CONCAT26(uStack_5b0._2_2_,
                             CONCAT24(uStack_5a0._2_2_,
                                      CONCAT22((undefined2)uStack_5b0,(undefined2)uStack_5a0)));
        uStack_920 = CONCAT26(uStack_5b0._6_2_,
                              CONCAT24(uStack_5a0._6_2_,CONCAT22(uStack_5b0._4_2_,uStack_5a0._4_2_))
                             );
        local_938 = local_1368;
        auVar27._8_8_ = uStack_920;
        auVar27._0_8_ = local_928;
        auVar26._8_8_ = local_cb8;
        auVar26._0_8_ = local_1368;
        auVar104 = pmaddwd(auVar27,auVar26);
        local_948 = CONCAT26(uStack_5d0._2_2_,
                             CONCAT24(uStack_5c0._2_2_,
                                      CONCAT22((undefined2)uStack_5d0,(undefined2)uStack_5c0)));
        uStack_940 = CONCAT26(uStack_5d0._6_2_,
                              CONCAT24(uStack_5c0._6_2_,CONCAT22(uStack_5d0._4_2_,uStack_5c0._4_2_))
                             );
        uStack_950 = CONCAT44(local_a98._4_4_,uStack_c00);
        auVar25._8_8_ = uStack_940;
        auVar25._0_8_ = local_948;
        auVar24._8_8_ = uStack_950;
        auVar24._0_8_ = local_1378;
        auVar105 = pmaddwd(auVar25,auVar24);
        local_968 = CONCAT26(uStack_5f0._2_2_,
                             CONCAT24(uStack_5e0._2_2_,
                                      CONCAT22((undefined2)uStack_5f0,(undefined2)uStack_5e0)));
        uStack_960 = CONCAT26(uStack_5f0._6_2_,
                              CONCAT24(uStack_5e0._6_2_,CONCAT22(uStack_5f0._4_2_,uStack_5e0._4_2_))
                             );
        local_978 = local_1388;
        auVar23._8_8_ = uStack_960;
        auVar23._0_8_ = local_968;
        auVar22._8_8_ = local_cd8;
        auVar22._0_8_ = local_1388;
        auVar106 = pmaddwd(auVar23,auVar22);
        local_988 = CONCAT26(uStack_610._2_2_,
                             CONCAT24(uStack_600._2_2_,
                                      CONCAT22((undefined2)uStack_610,(undefined2)uStack_600)));
        uStack_980 = CONCAT26(uStack_610._6_2_,
                              CONCAT24(uStack_600._6_2_,CONCAT22(uStack_610._4_2_,uStack_600._4_2_))
                             );
        uStack_990 = CONCAT44(uStack_9f0._4_4_,uStack_c20);
        auVar21._8_8_ = uStack_980;
        auVar21._0_8_ = local_988;
        auVar20._8_8_ = uStack_990;
        auVar20._0_8_ = local_1398;
        auVar107 = pmaddwd(auVar21,auVar20);
        local_13a8 = auVar104._0_8_;
        uStack_13a0 = auVar104._8_8_;
        local_13b8 = auVar105._0_8_;
        uStack_13b0 = auVar105._8_8_;
        local_688 = local_13a8;
        uVar78 = local_688;
        uStack_680 = uStack_13a0;
        uVar79 = uStack_680;
        local_698 = local_13b8;
        uVar76 = local_698;
        uStack_690 = uStack_13b0;
        uVar77 = uStack_690;
        local_688._0_4_ = auVar104._0_4_;
        local_688._4_4_ = auVar104._4_4_;
        uStack_680._0_4_ = auVar104._8_4_;
        uStack_680._4_4_ = auVar104._12_4_;
        local_698._0_4_ = auVar105._0_4_;
        local_698._4_4_ = auVar105._4_4_;
        uStack_690._0_4_ = auVar105._8_4_;
        uStack_690._4_4_ = auVar105._12_4_;
        local_6c8 = (int)local_688 + (int)local_698;
        iStack_6c4 = local_688._4_4_ + local_698._4_4_;
        iStack_6c0 = (int)uStack_680 + (int)uStack_690;
        iStack_6bc = uStack_680._4_4_ + uStack_690._4_4_;
        local_13c8 = auVar106._0_8_;
        uStack_13c0 = auVar106._8_8_;
        local_13d8 = auVar107._0_8_;
        uStack_13d0 = auVar107._8_8_;
        local_6a8 = local_13c8;
        uVar74 = local_6a8;
        uStack_6a0 = uStack_13c0;
        uVar75 = uStack_6a0;
        local_6b8 = local_13d8;
        uStack_6b0 = uStack_13d0;
        local_6a8._0_4_ = auVar106._0_4_;
        local_6a8._4_4_ = auVar106._4_4_;
        uStack_6a0._0_4_ = auVar106._8_4_;
        uStack_6a0._4_4_ = auVar106._12_4_;
        local_6d8 = (int)local_6a8 + auVar107._0_4_;
        iStack_6d4 = local_6a8._4_4_ + auVar107._4_4_;
        iStack_6d0 = (int)uStack_6a0 + auVar107._8_4_;
        iStack_6cc = uStack_6a0._4_4_ + auVar107._12_4_;
        iVar93 = local_6c8 + local_6d8;
        iVar94 = iStack_6c4 + iStack_6d4;
        iVar110 = iStack_6c0 + iStack_6d0;
        iVar112 = iStack_6bc + iStack_6cc;
        local_ac8 = CONCAT44(iVar108,iVar103);
        uStack_ac0 = CONCAT44(iVar111,iVar109);
        local_ad8 = CONCAT44(iVar94,iVar93);
        uStack_ad0 = CONCAT44(iVar112,iVar110);
        local_13f8 = CONCAT44(iVar93,iVar103);
        uStack_13f0._0_4_ = iVar108;
        uStack_13f0._4_4_ = iVar94;
        local_a28 = CONCAT44(iVar108,iVar103);
        uStack_a20 = CONCAT44(iVar111,iVar109);
        local_a38 = CONCAT44(iVar94,iVar93);
        uStack_a30 = CONCAT44(iVar112,iVar110);
        local_1408 = CONCAT44(iVar110,iVar109);
        uStack_1400._0_4_ = iVar111;
        uStack_1400._4_4_ = iVar112;
        if (in_stack_00000048[8] == 0) {
          local_e24 = ((1 << (local_f8c & 0x1f)) >> 1) - (1 << ((bVar68 + local_f8c) - 1 & 0x1f));
          local_898 = CONCAT44(local_e24,local_e24);
          uStack_890 = CONCAT44(local_e24,local_e24);
          local_868 = local_13f8;
          uStack_860 = uStack_13f0;
          local_408 = iVar103 + local_e24;
          iStack_404 = iVar93 + local_e24;
          iStack_400 = iVar108 + local_e24;
          iStack_3fc = iVar94 + local_e24;
          auVar104 = ZEXT416(uVar91);
          local_888 = local_1408;
          uStack_880 = uStack_1400;
          local_428 = iVar109 + local_e24;
          iStack_424 = iVar110 + local_e24;
          iStack_420 = iVar111 + local_e24;
          iStack_41c = iVar112 + local_e24;
          auVar105 = ZEXT416(uVar91);
          local_1e8 = CONCAT44(iStack_404 >> auVar104,local_408 >> auVar104);
          uStack_1e0 = CONCAT44(iStack_3fc >> auVar104,iStack_400 >> auVar104);
          local_1f8 = CONCAT44(iStack_424 >> auVar105,local_428 >> auVar105);
          uStack_1f0 = CONCAT44(iStack_41c >> auVar105,iStack_420 >> auVar105);
          auVar55._8_8_ = uStack_1e0;
          auVar55._0_8_ = local_1e8;
          auVar54._8_8_ = uStack_1f0;
          auVar54._0_8_ = local_1f8;
          auVar104 = packssdw(auVar55,auVar54);
          in_stack_ffffffffffffeabe = (short)(1 << (bVar68 & 0x1f)) + -1;
          local_2f8 = CONCAT26(in_stack_ffffffffffffeabe,
                               CONCAT24(in_stack_ffffffffffffeabe,
                                        CONCAT22(in_stack_ffffffffffffeabe,in_stack_ffffffffffffeabe
                                                )));
          in_stack_ffffffffffffeb30 =
               CONCAT26(in_stack_ffffffffffffeabe,
                        CONCAT24(in_stack_ffffffffffffeabe,
                                 CONCAT22(in_stack_ffffffffffffeabe,in_stack_ffffffffffffeabe)));
          local_1d8 = 0;
          uStack_1d0 = 0;
          in_stack_ffffffffffffeb18 = (__m128i *)0x0;
          in_stack_ffffffffffffeb20 = (__m128i *)0x0;
          _local_14c8 = auVar104._0_8_;
          uStack_14c0 = auVar104._8_8_;
          local_2e8 = _local_14c8;
          uVar72 = local_2e8;
          uStack_2e0 = uStack_14c0;
          uVar73 = uStack_2e0;
          local_2e8._0_2_ = auVar104._0_2_;
          local_2e8._2_2_ = auVar104._2_2_;
          local_2e8._4_2_ = auVar104._4_2_;
          local_2e8._6_2_ = auVar104._6_2_;
          uStack_2e0._0_2_ = auVar104._8_2_;
          uStack_2e0._2_2_ = auVar104._10_2_;
          uStack_2e0._4_2_ = auVar104._12_2_;
          uStack_2e0._6_2_ = auVar104._14_2_;
          local_1b8 = (ushort)(in_stack_ffffffffffffeabe < (short)local_2e8) *
                      in_stack_ffffffffffffeabe |
                      (ushort)(in_stack_ffffffffffffeabe >= (short)local_2e8) * (short)local_2e8;
          uStack_1b6 = (ushort)(in_stack_ffffffffffffeabe < local_2e8._2_2_) *
                       in_stack_ffffffffffffeabe |
                       (ushort)(in_stack_ffffffffffffeabe >= local_2e8._2_2_) * local_2e8._2_2_;
          uStack_1b4 = (ushort)(in_stack_ffffffffffffeabe < local_2e8._4_2_) *
                       in_stack_ffffffffffffeabe |
                       (ushort)(in_stack_ffffffffffffeabe >= local_2e8._4_2_) * local_2e8._4_2_;
          uStack_1b2 = (ushort)(in_stack_ffffffffffffeabe < local_2e8._6_2_) *
                       in_stack_ffffffffffffeabe |
                       (ushort)(in_stack_ffffffffffffeabe >= local_2e8._6_2_) * local_2e8._6_2_;
          uStack_1b0 = (ushort)(in_stack_ffffffffffffeabe < (short)uStack_2e0) *
                       in_stack_ffffffffffffeabe |
                       (ushort)(in_stack_ffffffffffffeabe >= (short)uStack_2e0) * (short)uStack_2e0;
          uStack_1ae = (ushort)(in_stack_ffffffffffffeabe < uStack_2e0._2_2_) *
                       in_stack_ffffffffffffeabe |
                       (ushort)(in_stack_ffffffffffffeabe >= uStack_2e0._2_2_) * uStack_2e0._2_2_;
          uStack_1ac = (ushort)(in_stack_ffffffffffffeabe < uStack_2e0._4_2_) *
                       in_stack_ffffffffffffeabe |
                       (ushort)(in_stack_ffffffffffffeabe >= uStack_2e0._4_2_) * uStack_2e0._4_2_;
          uStack_1aa = (ushort)(in_stack_ffffffffffffeabe < uStack_2e0._6_2_) *
                       in_stack_ffffffffffffeabe |
                       (ushort)(in_stack_ffffffffffffeabe >= uStack_2e0._6_2_) * uStack_2e0._6_2_;
          local_1c8 = 0;
          uStack_1c0 = 0;
          reduce_bits_horiz_00 =
               CONCAT22((-1 < (short)uStack_1b6) * uStack_1b6,(-1 < (short)local_1b8) * local_1b8);
          local_14c8 = CONCAT24((-1 < (short)uStack_1b4) * uStack_1b4,reduce_bits_horiz_00);
          _local_14c8 = CONCAT26((-1 < (short)uStack_1b2) * uStack_1b2,local_14c8);
          uStack_14c0._0_2_ = (-1 < (short)uStack_1b0) * uStack_1b0;
          uStack_14c0._2_2_ = (-1 < (short)uStack_1ae) * uStack_1ae;
          uStack_14c0._4_2_ = (-1 < (short)uStack_1ac) * uStack_1ac;
          uStack_14c0._6_2_ = (-1 < (short)uStack_1aa) * uStack_1aa;
          auVar104 = _local_14c8;
          in_stack_ffffffffffffeb10 =
               (__m128i *)
               (local_e88 + (long)((local_f7c + local_f84 + 4) * in_stack_00000028 + local_f80) * 2)
          ;
          uStack_14c0 = auVar104._8_8_;
          in_stack_ffffffffffffeab8 = uVar91;
          local_e60 = in_stack_ffffffffffffeabe;
          local_878 = local_898;
          uStack_870 = uStack_890;
          local_42c = uVar91;
          local_40c = uVar91;
          uStack_2f0 = in_stack_ffffffffffffeb30;
          local_2e8 = uVar72;
          uStack_2e0 = uVar73;
          local_128 = local_2f8;
          uStack_120 = in_stack_ffffffffffffeb30;
          local_118 = in_stack_ffffffffffffeabe;
          local_116 = in_stack_ffffffffffffeabe;
          local_114 = in_stack_ffffffffffffeabe;
          local_112 = in_stack_ffffffffffffeabe;
          local_110 = in_stack_ffffffffffffeabe;
          local_10e = in_stack_ffffffffffffeabe;
          local_10c = in_stack_ffffffffffffeabe;
          local_10a = in_stack_ffffffffffffeabe;
          local_48 = local_898;
          uStack_40 = uStack_890;
          local_30 = local_e24;
          local_2c = local_e24;
          local_28 = local_e24;
          local_24 = local_e24;
          if (in_stack_00000018 == 4) {
            lStack_290 = uStack_14c0;
            (*in_stack_ffffffffffffeb10)[0] = _local_14c8;
            local_298 = _local_14c8;
            local_280 = in_stack_ffffffffffffeb10;
          }
          else {
            lStack_1a0 = uStack_14c0;
            (*in_stack_ffffffffffffeb10)[0] = _local_14c8;
            (*in_stack_ffffffffffffeb10)[1] = uStack_14c0;
            local_1a8 = _local_14c8;
            local_190 = in_stack_ffffffffffffeb10;
          }
        }
        else {
          puVar97 = (ulong *)(*(long *)(in_stack_00000048 + 2) +
                             (long)((local_f7c + local_f84 + 4) * in_stack_00000048[4] + local_f80)
                             * 2);
          local_6e8 = local_13f8;
          uStack_6e0 = uStack_13f0;
          local_13f8 = CONCAT44(iVar93 + iVar102,iVar103 + iVar102);
          uStack_13f0._0_4_ = iVar108 + iVar102;
          uStack_13f0._4_4_ = iVar94 + iVar102;
          local_708 = local_13f8;
          uStack_700 = uStack_13f0;
          local_528 = iVar103 + iVar102 + iVar99;
          iStack_524 = iVar93 + iVar102 + iVar99;
          iStack_520 = iVar108 + iVar102 + iVar99;
          iStack_51c = iVar94 + iVar102 + iVar99;
          local_538 = uVar71;
          uStack_530 = 0;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar71;
          local_13f8 = CONCAT44(iStack_524 >> auVar39,local_528 >> auVar39);
          uStack_13f0._0_4_ = iStack_520 >> auVar39;
          uStack_13f0._4_4_ = iStack_51c >> auVar39;
          if (*in_stack_00000048 == 0) {
            local_328 = local_13f8;
            uStack_320 = uStack_13f0;
            local_338 = local_13f8;
            uStack_330 = uStack_13f0;
            auVar51._8_8_ = uStack_13f0;
            auVar51._0_8_ = local_13f8;
            auVar50._8_8_ = uStack_13f0;
            auVar50._0_8_ = local_13f8;
            auVar104 = packusdw(auVar51,auVar50);
            local_13f8 = auVar104._0_8_;
            uStack_13f0 = auVar104._8_8_;
            local_238 = local_13f8;
            uStack_230 = uStack_13f0;
            *puVar97 = local_13f8;
            local_220 = puVar97;
          }
          else {
            local_200 = (undefined8 *)
                        (local_e88 +
                        (long)((local_f7c + 4 + local_f84) * in_stack_00000028 + local_f80) * 2);
            local_4d8 = *puVar97;
            uStack_4d0 = 0;
            local_508._8_8_ = 0;
            local_508._0_8_ = local_4d8;
            auVar104 = pmovzxwd(local_508,local_4d8);
            local_1428 = auVar104._0_8_;
            uStack_1420 = auVar104._8_8_;
            if (in_stack_00000048[9] == 0) {
              local_748 = local_1428;
              uVar72 = local_748;
              uStack_740 = uStack_1420;
              uVar73 = uStack_740;
              local_758 = local_13f8;
              uStack_750 = uStack_13f0;
              local_748._0_4_ = auVar104._0_4_;
              local_748._4_4_ = auVar104._4_4_;
              uStack_740._0_4_ = auVar104._8_4_;
              uStack_740._4_4_ = auVar104._12_4_;
              local_3a8 = (int)local_748 + (local_528 >> auVar39);
              iStack_3a4 = local_748._4_4_ + (iStack_524 >> auVar39);
              iStack_3a0 = (int)uStack_740 + (iStack_520 >> auVar39);
              iStack_39c = uStack_740._4_4_ + (iStack_51c >> auVar39);
              local_3ac = 1;
              auVar104 = ZEXT416(1);
              local_13f8._4_4_ = iStack_3a4 >> auVar104;
              local_13f8._0_4_ = local_3a8 >> auVar104;
              uStack_13f0._0_4_ = iStack_3a0 >> auVar104;
              uStack_13f0._4_4_ = iStack_39c >> auVar104;
              local_748 = uVar72;
              uStack_740 = uVar73;
            }
            else {
              local_448 = local_1428;
              uStack_440 = uStack_1420;
              auVar45._8_8_ = uVar65;
              auVar45._0_8_ = uVar64;
              local_728 = pmulld(auVar104,auVar45);
              local_468 = local_13f8;
              uStack_460 = uStack_13f0;
              auVar44._8_8_ = uStack_13f0;
              auVar44._0_8_ = local_13f8;
              auVar43._8_8_ = uVar67;
              auVar43._0_8_ = uVar66;
              local_738 = pmulld(auVar44,auVar43);
              local_13f8 = CONCAT44(local_728._4_4_ + local_738._4_4_,
                                    local_728._0_4_ + local_738._0_4_);
              uStack_13f0._0_4_ = local_728._8_4_ + local_738._8_4_;
              uStack_13f0._4_4_ = local_728._12_4_ + local_738._12_4_;
              local_388 = local_13f8;
              uStack_380 = uStack_13f0;
              local_38c = 4;
              auVar104 = ZEXT416(4);
              local_13f8._4_4_ = (int)(local_728._4_4_ + local_738._4_4_) >> auVar104;
              local_13f8._0_4_ = (int)(local_728._0_4_ + local_738._0_4_) >> auVar104;
              uStack_13f0._0_4_ = (int)(local_728._8_4_ + local_738._8_4_) >> auVar104;
              uStack_13f0._4_4_ = (int)(local_728._12_4_ + local_738._12_4_) >> auVar104;
              local_478 = uVar66;
              uStack_470 = uVar67;
              local_458 = uVar64;
              uStack_450 = uVar65;
            }
            local_768 = local_13f8;
            uVar72 = local_768;
            uStack_760 = uStack_13f0;
            uVar73 = uStack_760;
            local_768._0_4_ = (int)local_13f8;
            local_768._4_4_ = local_13f8._4_4_;
            uStack_760._0_4_ = local_13f8._8_4_;
            uStack_760._4_4_ = local_13f8._12_4_;
            local_788 = CONCAT44(local_768._4_4_ + iVar100,(int)local_768 + iVar100);
            uStack_780 = CONCAT44(uStack_760._4_4_ + iVar100,(int)uStack_760 + iVar100);
            local_548 = (int)local_768 + iVar100 + iVar92;
            iStack_544 = local_768._4_4_ + iVar100 + iVar92;
            iStack_540 = (int)uStack_760 + iVar100 + iVar92;
            iStack_53c = uStack_760._4_4_ + iVar100 + iVar92;
            local_558 = uVar70;
            uStack_550 = 0;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = uVar70;
            local_318 = CONCAT44(iStack_544 >> auVar38,local_548 >> auVar38);
            uStack_310 = CONCAT44(iStack_53c >> auVar38,iStack_540 >> auVar38);
            auVar53._8_8_ = uStack_310;
            auVar53._0_8_ = local_318;
            auVar52._8_8_ = uStack_310;
            auVar52._0_8_ = local_318;
            auVar104 = packusdw(auVar53,auVar52);
            local_1448 = auVar104._0_8_;
            uStack_1440 = auVar104._8_8_;
            local_2a8 = local_1448;
            uVar88 = local_2a8;
            uStack_2a0 = uStack_1440;
            uVar89 = uStack_2a0;
            local_2a8._0_2_ = auVar104._0_2_;
            local_2a8._2_2_ = auVar104._2_2_;
            local_2a8._4_2_ = auVar104._4_2_;
            local_2a8._6_2_ = auVar104._6_2_;
            uStack_2a0._0_2_ = auVar104._8_2_;
            uStack_2a0._2_2_ = auVar104._10_2_;
            uStack_2a0._4_2_ = auVar104._12_2_;
            uStack_2a0._6_2_ = auVar104._14_2_;
            local_1448._0_4_ =
                 CONCAT22((ushort)(sVar90 < local_2a8._2_2_) * sVar90 |
                          (ushort)(sVar90 >= local_2a8._2_2_) * local_2a8._2_2_,
                          (ushort)(sVar90 < (short)local_2a8) * sVar90 |
                          (ushort)(sVar90 >= (short)local_2a8) * (short)local_2a8);
            local_1448._0_6_ =
                 CONCAT24((ushort)(sVar90 < local_2a8._4_2_) * sVar90 |
                          (ushort)(sVar90 >= local_2a8._4_2_) * local_2a8._4_2_,
                          (undefined4)local_1448);
            local_1448 = CONCAT26((ushort)(sVar90 < local_2a8._6_2_) * sVar90 |
                                  (ushort)(sVar90 >= local_2a8._6_2_) * local_2a8._6_2_,
                                  (undefined6)local_1448);
            uStack_1440._0_2_ =
                 (ushort)(sVar90 < (short)uStack_2a0) * sVar90 |
                 (ushort)(sVar90 >= (short)uStack_2a0) * (short)uStack_2a0;
            uStack_1440._2_2_ =
                 (ushort)(sVar90 < uStack_2a0._2_2_) * sVar90 |
                 (ushort)(sVar90 >= uStack_2a0._2_2_) * uStack_2a0._2_2_;
            uStack_1440._4_2_ =
                 (ushort)(sVar90 < uStack_2a0._4_2_) * sVar90 |
                 (ushort)(sVar90 >= uStack_2a0._4_2_) * uStack_2a0._4_2_;
            uStack_1440._6_2_ =
                 (ushort)(sVar90 < uStack_2a0._6_2_) * sVar90 |
                 (ushort)(sVar90 >= uStack_2a0._6_2_) * uStack_2a0._6_2_;
            local_218 = local_1448;
            uStack_210 = uStack_1440;
            *local_200 = local_1448;
            local_798 = uVar62;
            uStack_790 = uVar63;
            local_778 = uVar60;
            uStack_770 = uVar61;
            local_768 = uVar72;
            uStack_760 = uVar73;
            local_4c0 = puVar97;
            local_308 = local_318;
            uStack_300 = uStack_310;
            local_2b8 = uVar2;
            uStack_2b0 = uVar3;
            local_2a8 = uVar88;
            uStack_2a0 = uVar89;
          }
          auVar104 = _local_14c8;
          local_718 = uVar56;
          uStack_710 = uVar57;
          local_6f8 = uVar58;
          uStack_6f0 = uVar59;
          if (4 < in_stack_00000018) {
            puVar97 = (ulong *)(*(long *)(in_stack_00000048 + 2) +
                               (long)((local_f7c + local_f84 + 4) * in_stack_00000048[4] + local_f80
                                     + 4) * 2);
            local_7a8 = local_1408;
            uStack_7a0 = uStack_1400;
            local_1408 = CONCAT44(iVar110 + iVar102,iVar109 + iVar102);
            uStack_1400._0_4_ = iVar111 + iVar102;
            uStack_1400._4_4_ = iVar112 + iVar102;
            local_7c8 = local_1408;
            uStack_7c0 = uStack_1400;
            local_568 = iVar109 + iVar102 + iVar99;
            iStack_564 = iVar110 + iVar102 + iVar99;
            iStack_560 = iVar111 + iVar102 + iVar99;
            iStack_55c = iVar112 + iVar102 + iVar99;
            local_578 = uVar71;
            uStack_570 = 0;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = uVar71;
            local_1408 = CONCAT44(iStack_564 >> auVar37,local_568 >> auVar37);
            uStack_1400._0_4_ = iStack_560 >> auVar37;
            uStack_1400._4_4_ = iStack_55c >> auVar37;
            local_7d8 = uVar56;
            uStack_7d0 = uVar57;
            local_7b8 = uVar58;
            uStack_7b0 = uVar59;
            if (*in_stack_00000048 == 0) {
              local_368 = local_1408;
              uStack_360 = uStack_1400;
              local_378 = local_1408;
              uStack_370 = uStack_1400;
              auVar47._8_8_ = uStack_1400;
              auVar47._0_8_ = local_1408;
              auVar46._8_8_ = uStack_1400;
              auVar46._0_8_ = local_1408;
              auVar105 = packusdw(auVar47,auVar46);
              local_1408 = auVar105._0_8_;
              uStack_1400 = auVar105._8_8_;
              local_278 = local_1408;
              uStack_270 = uStack_1400;
              *puVar97 = local_1408;
              local_260 = puVar97;
            }
            else {
              local_240 = (undefined8 *)
                          (local_e88 + 8 +
                          (long)((local_f7c + 4 + local_f84) * in_stack_00000028 + local_f80) * 2);
              local_4f8 = *puVar97;
              uStack_4f0 = 0;
              local_518._8_8_ = 0;
              local_518._0_8_ = local_4f8;
              auVar105 = pmovzxwd(local_518,local_4f8);
              local_1468 = auVar105._0_8_;
              uStack_1460 = auVar105._8_8_;
              if (in_stack_00000048[9] == 0) {
                local_808 = local_1468;
                uVar72 = local_808;
                uStack_800 = uStack_1460;
                uVar73 = uStack_800;
                local_818 = local_1408;
                uStack_810 = uStack_1400;
                local_808._0_4_ = auVar105._0_4_;
                local_808._4_4_ = auVar105._4_4_;
                uStack_800._0_4_ = auVar105._8_4_;
                uStack_800._4_4_ = auVar105._12_4_;
                local_3e8 = (int)local_808 + (local_568 >> auVar37);
                iStack_3e4 = local_808._4_4_ + (iStack_564 >> auVar37);
                iStack_3e0 = (int)uStack_800 + (iStack_560 >> auVar37);
                iStack_3dc = uStack_800._4_4_ + (iStack_55c >> auVar37);
                local_3ec = 1;
                auVar105 = ZEXT416(1);
                local_1408._4_4_ = iStack_3e4 >> auVar105;
                local_1408._0_4_ = local_3e8 >> auVar105;
                uStack_1400._0_4_ = iStack_3e0 >> auVar105;
                uStack_1400._4_4_ = iStack_3dc >> auVar105;
                local_808 = uVar72;
                uStack_800 = uVar73;
              }
              else {
                local_488 = local_1468;
                uStack_480 = uStack_1460;
                auVar42._8_8_ = uVar65;
                auVar42._0_8_ = uVar64;
                local_7e8 = pmulld(auVar105,auVar42);
                local_4a8 = local_1408;
                uStack_4a0 = uStack_1400;
                auVar41._8_8_ = uStack_1400;
                auVar41._0_8_ = local_1408;
                auVar40._8_8_ = uVar67;
                auVar40._0_8_ = uVar66;
                local_7f8 = pmulld(auVar41,auVar40);
                local_1408 = CONCAT44(local_7e8._4_4_ + local_7f8._4_4_,
                                      local_7e8._0_4_ + local_7f8._0_4_);
                uStack_1400._0_4_ = local_7e8._8_4_ + local_7f8._8_4_;
                uStack_1400._4_4_ = local_7e8._12_4_ + local_7f8._12_4_;
                local_3c8 = local_1408;
                uStack_3c0 = uStack_1400;
                local_3cc = 4;
                auVar105 = ZEXT416(4);
                local_1408._4_4_ = (int)(local_7e8._4_4_ + local_7f8._4_4_) >> auVar105;
                local_1408._0_4_ = (int)(local_7e8._0_4_ + local_7f8._0_4_) >> auVar105;
                uStack_1400._0_4_ = (int)(local_7e8._8_4_ + local_7f8._8_4_) >> auVar105;
                uStack_1400._4_4_ = (int)(local_7e8._12_4_ + local_7f8._12_4_) >> auVar105;
                local_4b8 = uVar66;
                uStack_4b0 = uVar67;
                local_498 = uVar64;
                uStack_490 = uVar65;
              }
              local_828 = local_1408;
              uVar72 = local_828;
              uStack_820 = uStack_1400;
              uVar73 = uStack_820;
              local_828._0_4_ = (int)local_1408;
              local_828._4_4_ = local_1408._4_4_;
              uStack_820._0_4_ = local_1408._8_4_;
              uStack_820._4_4_ = local_1408._12_4_;
              local_848 = CONCAT44(local_828._4_4_ + iVar100,(int)local_828 + iVar100);
              uStack_840 = CONCAT44(uStack_820._4_4_ + iVar100,(int)uStack_820 + iVar100);
              local_588 = (int)local_828 + iVar100 + iVar92;
              iStack_584 = local_828._4_4_ + iVar100 + iVar92;
              iStack_580 = (int)uStack_820 + iVar100 + iVar92;
              iStack_57c = uStack_820._4_4_ + iVar100 + iVar92;
              local_598 = uVar70;
              uStack_590 = 0;
              auVar36._8_8_ = 0;
              auVar36._0_8_ = uVar70;
              local_358 = CONCAT44(iStack_584 >> auVar36,local_588 >> auVar36);
              uStack_350 = CONCAT44(iStack_57c >> auVar36,iStack_580 >> auVar36);
              auVar49._8_8_ = uStack_350;
              auVar49._0_8_ = local_358;
              auVar48._8_8_ = uStack_350;
              auVar48._0_8_ = local_358;
              auVar105 = packusdw(auVar49,auVar48);
              local_1488 = auVar105._0_8_;
              uStack_1480 = auVar105._8_8_;
              local_2c8 = local_1488;
              uVar88 = local_2c8;
              uStack_2c0 = uStack_1480;
              uVar89 = uStack_2c0;
              local_2c8._0_2_ = auVar105._0_2_;
              local_2c8._2_2_ = auVar105._2_2_;
              local_2c8._4_2_ = auVar105._4_2_;
              local_2c8._6_2_ = auVar105._6_2_;
              uStack_2c0._0_2_ = auVar105._8_2_;
              uStack_2c0._2_2_ = auVar105._10_2_;
              uStack_2c0._4_2_ = auVar105._12_2_;
              uStack_2c0._6_2_ = auVar105._14_2_;
              local_1488._0_4_ =
                   CONCAT22((ushort)(sVar90 < local_2c8._2_2_) * sVar90 |
                            (ushort)(sVar90 >= local_2c8._2_2_) * local_2c8._2_2_,
                            (ushort)(sVar90 < (short)local_2c8) * sVar90 |
                            (ushort)(sVar90 >= (short)local_2c8) * (short)local_2c8);
              local_1488._0_6_ =
                   CONCAT24((ushort)(sVar90 < local_2c8._4_2_) * sVar90 |
                            (ushort)(sVar90 >= local_2c8._4_2_) * local_2c8._4_2_,
                            (undefined4)local_1488);
              local_1488 = CONCAT26((ushort)(sVar90 < local_2c8._6_2_) * sVar90 |
                                    (ushort)(sVar90 >= local_2c8._6_2_) * local_2c8._6_2_,
                                    (undefined6)local_1488);
              uStack_1480._0_2_ =
                   (ushort)(sVar90 < (short)uStack_2c0) * sVar90 |
                   (ushort)(sVar90 >= (short)uStack_2c0) * (short)uStack_2c0;
              uStack_1480._2_2_ =
                   (ushort)(sVar90 < uStack_2c0._2_2_) * sVar90 |
                   (ushort)(sVar90 >= uStack_2c0._2_2_) * uStack_2c0._2_2_;
              uStack_1480._4_2_ =
                   (ushort)(sVar90 < uStack_2c0._4_2_) * sVar90 |
                   (ushort)(sVar90 >= uStack_2c0._4_2_) * uStack_2c0._4_2_;
              uStack_1480._6_2_ =
                   (ushort)(sVar90 < uStack_2c0._6_2_) * sVar90 |
                   (ushort)(sVar90 >= uStack_2c0._6_2_) * uStack_2c0._6_2_;
              local_258 = local_1488;
              uStack_250 = uStack_1480;
              *local_240 = local_1488;
              local_858 = uVar62;
              uStack_850 = uVar63;
              local_838 = uVar60;
              uStack_830 = uVar61;
              local_828 = uVar72;
              uStack_820 = uVar73;
              local_4e0 = puVar97;
              local_348 = local_358;
              uStack_340 = uStack_350;
              local_2d8 = uVar2;
              uStack_2d0 = uVar3;
              local_2c8 = uVar88;
              uStack_2c0 = uVar89;
            }
          }
        }
        _local_14c8 = auVar104;
        local_f84 = local_f84 + 1;
        local_b58 = uVar11;
        local_b48 = uVar10;
        local_b38 = uVar9;
        local_b28 = uVar8;
        local_b18 = uVar7;
        local_b08 = uVar6;
        local_af8 = uVar5;
        local_ae8 = uVar4;
        local_ab8 = local_a18;
        local_aa8 = local_a08;
        local_a98 = local_9f8;
        local_a88 = local_9e8;
        local_a78 = local_9d8;
        local_a68 = local_9c8;
        local_a58 = local_9b8;
        local_a48 = local_9a8;
        uStack_a10 = uStack_ab0;
        uStack_a00 = uStack_aa0;
        uStack_9f0 = uStack_a90;
        uStack_9e0 = uStack_a80;
        uStack_9d0 = uStack_a70;
        uStack_9c0 = uStack_a60;
        uStack_9b0 = uStack_a50;
        uStack_9a0 = uStack_a40;
        uStack_970 = local_cd8;
        uStack_930 = local_cb8;
        uStack_8f0 = local_c98;
        uStack_8b0 = local_c78;
        local_6a8 = uVar74;
        uStack_6a0 = uVar75;
        local_698 = uVar76;
        uStack_690 = uVar77;
        local_688 = uVar78;
        uStack_680 = uVar79;
        local_658 = uVar80;
        uStack_650 = uVar81;
        local_648 = uVar82;
        uStack_640 = uVar83;
        local_638 = uVar84;
        uStack_630 = uVar85;
        local_628 = uVar86;
        uStack_620 = uVar87;
        uStack_610 = uVar19;
        uStack_600 = uVar18;
        uStack_5f0 = uVar17;
        uStack_5e0 = uVar16;
        uStack_5d0 = uVar15;
        uStack_5c0 = uVar14;
        uStack_5b0 = uVar13;
        uStack_5a0 = uVar12;
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_warp_affine_sse4_1(const int32_t *mat, const uint16_t *ref,
                                   int width, int height, int stride,
                                   uint16_t *pred, int p_col, int p_row,
                                   int p_width, int p_height, int p_stride,
                                   int subsampling_x, int subsampling_y, int bd,
                                   ConvolveParams *conv_params, int16_t alpha,
                                   int16_t beta, int16_t gamma, int16_t delta) {
  __m128i tmp[15];
  int i, j, k;
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));
  assert(!(bd == 12 && reduce_bits_horiz < 5));
  assert(IMPLIES(conv_params->do_average, conv_params->is_compound));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const __m128i clip_pixel =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i reduce_bits_vert_shift = _mm_cvtsi32_si128(reduce_bits_vert);
  const __m128i reduce_bits_vert_const =
      _mm_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m128i res_add_const = _mm_set1_epi32(1 << offset_bits_vert);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const __m128i res_sub_const =
      _mm_set1_epi32(-(1 << (offset_bits - conv_params->round_1)) -
                     (1 << (offset_bits - conv_params->round_1 - 1)));
  __m128i round_bits_shift = _mm_cvtsi32_si128(round_bits);
  __m128i round_bits_const = _mm_set1_epi32(((1 << round_bits) >> 1));

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);

  /* Note: For this code to work, the left/right frame borders need to be
  extended by at least 13 pixels each. By the time we get here, other
  code will have set up this border, but we allow an explicit check
  for debugging purposes.
  */
  /*for (i = 0; i < height; ++i) {
  for (j = 0; j < 13; ++j) {
  assert(ref[i * stride - 13 + j] == ref[i * stride]);
  assert(ref[i * stride + width + j] == ref[i * stride + (width - 1)]);
  }
  }*/

  for (i = 0; i < p_height; i += 8) {
    for (j = 0; j < p_width; j += 8) {
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      // Add in all the constant terms, including rounding and offset
      sx4 += alpha * (-4) + beta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
      sy4 += gamma * (-4) + delta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      // If the block is aligned such that, after clamping, every sample
      // would be taken from the leftmost/rightmost column, then we can
      // skip the expensive horizontal filter.
      if (ix4 <= -7) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm_set1_epi16(
              (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
              ref[iy * stride] * (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (ix4 >= width + 6) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] =
              _mm_set1_epi16((1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
                             ref[iy * stride + (width - 1)] *
                                 (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        const int out_of_boundary_left = -(ix4 - 6);
        const int out_of_boundary_right = (ix4 + 8) - width;

        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          int sx = sx4 + beta * (k + 4);

          // Load source pixels
          const __m128i src =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
          const __m128i src2 =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 + 1));

          const __m128i src_01 = _mm_shuffle_epi8(
              src, _mm_loadu_si128((__m128i *)warp_highbd_arrange_bytes));
          const __m128i src2_01 = _mm_shuffle_epi8(
              src2, _mm_loadu_si128((__m128i *)warp_highbd_arrange_bytes));

          __m128i src_lo = _mm_unpacklo_epi64(src_01, src2_01);
          __m128i src_hi = _mm_unpackhi_epi64(src_01, src2_01);

          if (out_of_boundary_left >= 0) {
            const __m128i shuffle_reg_left =
                _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
            src_lo = _mm_shuffle_epi8(src_lo, shuffle_reg_left);
            src_hi = _mm_shuffle_epi8(src_hi, shuffle_reg_left);
          }

          if (out_of_boundary_right >= 0) {
            const __m128i shuffle_reg_right = _mm_loadu_si128(
                (__m128i *)warp_pad_right[out_of_boundary_right]);
            src_lo = _mm_shuffle_epi8(src_lo, shuffle_reg_right);
            src_hi = _mm_shuffle_epi8(src_hi, shuffle_reg_right);
          }

          const __m128i src_padded = _mm_unpacklo_epi8(src_lo, src_hi);
          const __m128i src2_padded = _mm_unpackhi_epi8(src_lo, src_hi);

          highbd_horiz_filter(&src_padded, &src2_padded, tmp, sx, alpha, k,
                              offset_bits_horiz, reduce_bits_horiz);
        }
      } else {
        highbd_prepare_warp_horizontal_filter(
            ref, tmp, stride, ix4, iy4, sx4, alpha, beta, p_height, height, i,
            offset_bits_horiz, reduce_bits_horiz);
      }

      // Vertical filter
      for (k = -4; k < AOMMIN(4, p_height - i - 4); ++k) {
        int sy = sy4 + delta * (k + 4);

        // Load from tmp and rearrange pairs of consecutive rows into the
        // column order 0 0 2 2 4 4 6 6; 1 1 3 3 5 5 7 7
        const __m128i *src = tmp + (k + 4);
        const __m128i src_0 = _mm_unpacklo_epi16(src[0], src[1]);
        const __m128i src_2 = _mm_unpacklo_epi16(src[2], src[3]);
        const __m128i src_4 = _mm_unpacklo_epi16(src[4], src[5]);
        const __m128i src_6 = _mm_unpacklo_epi16(src[6], src[7]);

        // Filter even-index pixels
        const __m128i tmp_0 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 0 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_2 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 2 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_4 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 4 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_6 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 6 * gamma) >> WARPEDDIFF_PREC_BITS)));

        const __m128i tmp_8 = _mm_unpacklo_epi32(tmp_0, tmp_2);
        const __m128i tmp_10 = _mm_unpacklo_epi32(tmp_4, tmp_6);
        const __m128i tmp_12 = _mm_unpackhi_epi32(tmp_0, tmp_2);
        const __m128i tmp_14 = _mm_unpackhi_epi32(tmp_4, tmp_6);

        const __m128i coeff_0 = _mm_unpacklo_epi64(tmp_8, tmp_10);
        const __m128i coeff_2 = _mm_unpackhi_epi64(tmp_8, tmp_10);
        const __m128i coeff_4 = _mm_unpacklo_epi64(tmp_12, tmp_14);
        const __m128i coeff_6 = _mm_unpackhi_epi64(tmp_12, tmp_14);

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_0);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_2);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_4);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_6);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 = _mm_unpackhi_epi16(src[0], src[1]);
        const __m128i src_3 = _mm_unpackhi_epi16(src[2], src[3]);
        const __m128i src_5 = _mm_unpackhi_epi16(src[4], src[5]);
        const __m128i src_7 = _mm_unpackhi_epi16(src[6], src[7]);

        const __m128i tmp_1 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 1 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_3 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 3 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_5 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 5 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_7 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 7 * gamma) >> WARPEDDIFF_PREC_BITS)));

        const __m128i tmp_9 = _mm_unpacklo_epi32(tmp_1, tmp_3);
        const __m128i tmp_11 = _mm_unpacklo_epi32(tmp_5, tmp_7);
        const __m128i tmp_13 = _mm_unpackhi_epi32(tmp_1, tmp_3);
        const __m128i tmp_15 = _mm_unpackhi_epi32(tmp_5, tmp_7);

        const __m128i coeff_1 = _mm_unpacklo_epi64(tmp_9, tmp_11);
        const __m128i coeff_3 = _mm_unpackhi_epi64(tmp_9, tmp_11);
        const __m128i coeff_5 = _mm_unpacklo_epi64(tmp_13, tmp_15);
        const __m128i coeff_7 = _mm_unpackhi_epi64(tmp_13, tmp_15);

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_1);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_3);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_5);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_7);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        if (conv_params->is_compound) {
          __m128i *const p =
              (__m128i *)&conv_params
                  ->dst[(i + k + 4) * conv_params->dst_stride + j];
          res_lo = _mm_add_epi32(res_lo, res_add_const);
          res_lo = _mm_sra_epi32(_mm_add_epi32(res_lo, reduce_bits_vert_const),
                                 reduce_bits_vert_shift);

          if (conv_params->do_average) {
            __m128i *const dst16 = (__m128i *)&pred[(i + k + 4) * p_stride + j];
            __m128i p_32 = _mm_cvtepu16_epi32(_mm_loadl_epi64(p));

            if (conv_params->use_dist_wtd_comp_avg) {
              res_lo = _mm_add_epi32(_mm_mullo_epi32(p_32, wt0),
                                     _mm_mullo_epi32(res_lo, wt1));
              res_lo = _mm_srai_epi32(res_lo, DIST_PRECISION_BITS);
            } else {
              res_lo = _mm_srai_epi32(_mm_add_epi32(p_32, res_lo), 1);
            }

            __m128i res32_lo = _mm_add_epi32(res_lo, res_sub_const);
            res32_lo = _mm_sra_epi32(_mm_add_epi32(res32_lo, round_bits_const),
                                     round_bits_shift);

            __m128i res16_lo = _mm_packus_epi32(res32_lo, res32_lo);
            res16_lo = _mm_min_epi16(res16_lo, clip_pixel);
            _mm_storel_epi64(dst16, res16_lo);
          } else {
            res_lo = _mm_packus_epi32(res_lo, res_lo);
            _mm_storel_epi64(p, res_lo);
          }
          if (p_width > 4) {
            __m128i *const p4 =
                (__m128i *)&conv_params
                    ->dst[(i + k + 4) * conv_params->dst_stride + j + 4];

            res_hi = _mm_add_epi32(res_hi, res_add_const);
            res_hi =
                _mm_sra_epi32(_mm_add_epi32(res_hi, reduce_bits_vert_const),
                              reduce_bits_vert_shift);
            if (conv_params->do_average) {
              __m128i *const dst16_4 =
                  (__m128i *)&pred[(i + k + 4) * p_stride + j + 4];
              __m128i p4_32 = _mm_cvtepu16_epi32(_mm_loadl_epi64(p4));

              if (conv_params->use_dist_wtd_comp_avg) {
                res_hi = _mm_add_epi32(_mm_mullo_epi32(p4_32, wt0),
                                       _mm_mullo_epi32(res_hi, wt1));
                res_hi = _mm_srai_epi32(res_hi, DIST_PRECISION_BITS);
              } else {
                res_hi = _mm_srai_epi32(_mm_add_epi32(p4_32, res_hi), 1);
              }

              __m128i res32_hi = _mm_add_epi32(res_hi, res_sub_const);
              res32_hi = _mm_sra_epi32(
                  _mm_add_epi32(res32_hi, round_bits_const), round_bits_shift);
              __m128i res16_hi = _mm_packus_epi32(res32_hi, res32_hi);
              res16_hi = _mm_min_epi16(res16_hi, clip_pixel);
              _mm_storel_epi64(dst16_4, res16_hi);
            } else {
              res_hi = _mm_packus_epi32(res_hi, res_hi);
              _mm_storel_epi64(p4, res_hi);
            }
          }
        } else {
          // Round and pack into 8 bits
          const __m128i round_const =
              _mm_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                             ((1 << reduce_bits_vert) >> 1));

          const __m128i res_lo_round = _mm_srai_epi32(
              _mm_add_epi32(res_lo, round_const), reduce_bits_vert);
          const __m128i res_hi_round = _mm_srai_epi32(
              _mm_add_epi32(res_hi, round_const), reduce_bits_vert);

          __m128i res_16bit = _mm_packs_epi32(res_lo_round, res_hi_round);
          // Clamp res_16bit to the range [0, 2^bd - 1]
          const __m128i max_val = _mm_set1_epi16((1 << bd) - 1);
          const __m128i zero = _mm_setzero_si128();
          res_16bit = _mm_max_epi16(_mm_min_epi16(res_16bit, max_val), zero);

          // Store, blending with 'pred' if needed
          __m128i *const p = (__m128i *)&pred[(i + k + 4) * p_stride + j];

          // Note: If we're outputting a 4x4 block, we need to be very careful
          // to only output 4 pixels at this point, to avoid encode/decode
          // mismatches when encoding with multiple threads.
          if (p_width == 4) {
            _mm_storel_epi64(p, res_16bit);
          } else {
            _mm_storeu_si128(p, res_16bit);
          }
        }
      }
    }
  }
}